

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

int lws_h2_parser(lws *wsi,uchar *in,lws_filepos_t inlen,lws_filepos_t *inused)

{
  int32_t *piVar1;
  undefined1 *puVar2;
  byte bVar3;
  char cVar4;
  ushort uVar5;
  undefined4 uVar6;
  lws_h2_netconn *plVar7;
  lws_h2_netconn *plVar8;
  lws_context *plVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  lws_h2_protocol_send *plVar13;
  lws *plVar14;
  size_t sVar15;
  lws *plVar16;
  uint uVar17;
  char *pcVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint32_t uVar22;
  ulong uVar23;
  byte *pbVar24;
  byte *buf;
  ulong uVar25;
  bool bVar26;
  
  plVar7 = (wsi->h2).h2n;
  pbVar24 = in;
  if (plVar7 == (lws_h2_netconn *)0x0) {
    iVar12 = 1;
  }
  else {
    if (inlen != 0) {
      buf = in;
LAB_0012c83c:
      uVar25 = inlen - 1;
      pbVar24 = buf + 1;
      bVar10 = *buf;
      uVar5 = (ushort)wsi->wsistate;
      uVar17 = (uint)bVar10;
      if (0x20b < uVar5) {
        if (uVar5 == 0x30d) goto LAB_0012c93c;
        if (uVar5 != 0x20c) goto LAB_0012d486;
        uVar21 = plVar7->count;
        uVar11 = uVar21 + 1;
        plVar7->count = uVar11;
        iVar12 = 1;
        if ((int)"PRI * HTTP/2.0\r\n\r\nSM\r\n\r\n"[uVar21] == uVar17) {
          if ("PRI * HTTP/2.0\r\n\r\nSM\r\n\r\n"[uVar11] != '\0') goto LAB_0012d486;
          _lws_log(8,"http2: %p: established\n",wsi);
          lwsi_set_state(wsi,0x30d);
          lws_validity_confirmed(wsi);
          plVar7->count = 0;
          (wsi->txc).tx_cr = 0xffff;
          plVar13 = (lws_h2_protocol_send *)lws_realloc((void *)0x0,0x38,"pps");
          if (plVar13 != (lws_h2_protocol_send *)0x0) {
            plVar13->type = LWS_H2_PPS_MY_SETTINGS;
            lws_pps_schedule(wsi,plVar13);
            goto LAB_0012d486;
          }
LAB_0012dcff:
          iVar12 = 1;
        }
        goto LAB_0012dc9f;
      }
      if ((uVar5 != 0x10f) && (uVar5 != 0x119)) goto LAB_0012d486;
LAB_0012c93c:
      bVar3 = plVar7->frame_state;
      if (bVar3 == 9) {
        uVar21 = plVar7->count;
        uVar20 = uVar21 + 1;
        plVar7->count = uVar20;
        bVar3 = plVar7->flags;
        uVar11 = (uint)bVar10;
        if (((bVar3 & 8) != 0) && ((*(ushort *)&plVar7->field_0xa8 & 0x40) == 0)) {
          plVar7->padding = bVar10;
          *(ushort *)&plVar7->field_0xa8 = *(ushort *)&plVar7->field_0xa8 | 0x40;
          plVar7->preamble = plVar7->preamble + 1;
          if (plVar7->length - 1 < uVar11) {
            pcVar18 = "execssive padding";
LAB_0012cacf:
            lws_h2_goaway(wsi,1,pcVar18);
          }
          goto LAB_0012d486;
        }
        if (((bVar3 & 0x20) != 0) && ((plVar7->field_0xa8 & 0x80) == 0)) {
          _lws_log(0x10,"PRIORITY FLAG:  0x%x\n",(ulong)uVar11);
          uVar22 = plVar7->preamble;
          plVar7->preamble = uVar22 + 1;
          if (uVar22 - ((*(ushort *)&plVar7->field_0xa8 >> 6 & 1) != 0) < 4) {
            plVar7->dep = plVar7->dep << 8 | uVar11;
          }
          else {
            plVar7->weight_temp = bVar10;
            *(ushort *)&plVar7->field_0xa8 = *(ushort *)&plVar7->field_0xa8 | 0x80;
            _lws_log(0x10,"PRI FL: dep 0x%x, weight 0x%02X\n",(ulong)plVar7->dep,(ulong)uVar11);
          }
          goto LAB_0012d486;
        }
        if ((plVar7->padding != 0) && (plVar7->length - (uint)plVar7->padding < uVar20)) {
          if (bVar10 != 0) {
            pcVar18 = "nonzero padding";
            goto LAB_0012cacf;
          }
          goto switchD_0012cafb_caseD_5;
        }
        switch(plVar7->type) {
        case '\0':
          _lws_log(8,"%s: LWS_H2_FRAME_TYPE_DATA: fl 0x%x\n","lws_h2_parser");
          if (wsi->immortal_substream_count == '\0') {
            iVar12 = wsi->vhost->keepalive_timeout;
            if (iVar12 == 0) {
              iVar12 = 0x1f;
            }
            lws_set_timeout(wsi,PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,iVar12);
          }
          if (plVar7->swsi != (lws *)0x0) {
            sVar15 = lws_buflist_next_segment_len(&plVar7->swsi->buflist,(uint8_t **)0x0);
            if (sVar15 != 0) {
              _lws_log(8,"%s: substream has pending\n","lws_h2_parser");
            }
            plVar14 = plVar7->swsi;
            if ((plVar14->role_ops == &role_ops_h1 || plVar14->role_ops == &role_ops_h2) &&
               ((short)plVar14->wsistate == 0x119)) {
              lwsi_set_state(plVar14,0x17);
              _lws_log(8,"%s: swsi %p to LRS_BODY\n","lws_h2_parser",plVar7->swsi);
              plVar14 = plVar7->swsi;
            }
            iVar12 = lws_hdr_total_length(plVar14,WSI_TOKEN_HTTP_CONTENT_LENGTH);
            if ((((iVar12 == 0) || ((plVar7->swsi->http).rx_content_length == 0)) ||
                (inlen <= (plVar7->swsi->http).rx_content_remain)) ||
               (plVar7->length <= plVar7->inside)) {
              uVar17 = (plVar7->length - plVar7->count) + 1;
              if ((int)uVar25 < (int)uVar17) {
                uVar17 = (int)uVar25 + 1;
              }
              else {
                _lws_log(0x10,"---- restricting len to %d vs %ld\n",(ulong)uVar17,inlen);
              }
              plVar14 = plVar7->swsi;
              if ((*(ulong *)&plVar14->field_0x2dc >> 0x37 & 1) == 0) {
                if ((short)plVar14->wsistate == 0x110) {
                  iVar12 = lws_buflist_append_segment(&plVar14->buflist,buf,(long)(int)uVar17);
                  if (iVar12 < 0) {
                    return -1;
                  }
                  if (iVar12 != 0) {
                    plVar9 = wsi->context;
                    cVar4 = wsi->tsi;
                    _lws_log(0x10,"%s: added %p to rxflow list\n","lws_h2_parser");
                    lws_dll2_add_head(&plVar7->swsi->dll_buflist,
                                      &plVar9->pt[cVar4].dll_buflist_owner);
                  }
                  plVar7->inside = plVar7->inside + uVar17;
                  iVar12 = uVar17 - 1;
                  plVar7->count = plVar7->count + iVar12;
                  _lws_log(0x10,"%s: deferred %d\n","lws_h2_parser",(ulong)uVar17);
                  plVar14 = plVar7->swsi;
                }
                else {
                  *(ulong *)&plVar14->field_0x2dc = *(ulong *)&plVar14->field_0x2dc | 0x80000000000;
                  uVar17 = lws_read_h1(plVar7->swsi,buf,(long)(int)uVar17);
                  puVar2 = &plVar7->swsi->field_0x2dc;
                  *(ulong *)puVar2 = *(ulong *)puVar2 & 0xfffff7ffffffffff;
                  if (((int)uVar17 < 0) ||
                     ((uVar17 == 0 &&
                      (sVar15 = lws_buflist_next_segment_len(&wsi->buflist,(uint8_t **)0x0),
                      sVar15 == 0)))) {
                    _lws_log(8,"%s: lws_read_h1 told %d %u / %u\n","lws_h2_parser",(ulong)uVar17,
                             (ulong)plVar7->count,(ulong)plVar7->length);
                    uVar22 = plVar7->length;
                    pbVar24 = pbVar24 + (uVar22 - plVar7->count);
                    plVar7->inside = uVar22;
                    plVar7->count = uVar22 - 1;
                    goto LAB_0012ddd6;
                  }
                  plVar7->inside = plVar7->inside + uVar17;
                  iVar12 = uVar17 - 1;
                  plVar7->count = plVar7->count + iVar12;
                  plVar14 = plVar7->swsi;
                  piVar1 = &(plVar14->txc).peer_tx_cr_est;
                  *piVar1 = *piVar1 - uVar17;
                  piVar1 = &(wsi->txc).peer_tx_cr_est;
                  *piVar1 = *piVar1 - uVar17;
                }
                pbVar24 = pbVar24 + iVar12;
                uVar25 = uVar25 - (long)iVar12;
                if ((plVar14->flags & 0x200) == 0) {
                  if ((plVar14->txc).peer_tx_cr_est <= (int)uVar17) {
                    lws_h2_update_peer_txcredit(plVar14,plVar7->sid,uVar17);
                  }
                }
                else {
                  lws_h2_update_peer_txcredit(wsi,0,uVar17);
                  (plVar7->swsi->txc).manual = '\x01';
                }
              }
              else {
                sVar15 = (size_t)(int)uVar17;
                if (plVar14->protocol == (lws_protocols *)0x0) {
                  bVar26 = false;
                  _lws_log(1,"%s: swsi %p doesn\'t have protocol\n","lws_h2_parser");
                }
                else {
                  piVar1 = &(plVar14->txc).peer_tx_cr_est;
                  *piVar1 = *piVar1 - uVar17;
                  piVar1 = &(wsi->txc).peer_tx_cr_est;
                  *piVar1 = *piVar1 - uVar17;
                  lws_wsi_txc_describe(&plVar14->txc,"lws_h2_parser",(plVar14->mux).my_sid);
                  plVar14 = plVar7->swsi;
                  iVar12 = user_callback_handle_rxflow
                                     (plVar14->protocol->callback,plVar14,
                                      LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,plVar14->user_space,buf,
                                      sVar15);
                  bVar26 = iVar12 == 0;
                }
                pbVar24 = pbVar24 + (sVar15 - 1);
                plVar7->inside = plVar7->inside + uVar17;
                plVar7->count = (plVar7->count + uVar17) - 1;
                if (!bVar26) {
                  _lws_log(8,"RECEIVE_CLIENT_HTTP closed it\n");
LAB_0012ddd6:
                  lws_close_free_wsi(plVar7->swsi,LWS_CLOSE_STATUS_NOSTATUS,"close_swsi_and_return")
                  ;
                  plVar7->swsi = (lws *)0x0;
                  plVar7->frame_state = '\0';
                  plVar7->count = 0;
                  iVar12 = 2;
                  goto LAB_0012dc9f;
                }
                uVar25 = uVar25 - (sVar15 - 1);
              }
            }
            else {
              lws_h2_goaway(wsi,1,"More rx than content_length told");
            }
          }
          break;
        case '\x01':
        case '\t':
          if ((plVar7->swsi != (lws *)0x0) &&
             (iVar12 = lws_hpack_interpret(plVar7->swsi,bVar10), iVar12 != 0)) {
            _lws_log(8,"%s: hpack failed\n","lws_h2_parser");
            goto LAB_0012dcff;
          }
          break;
        case '\x02':
          if (uVar20 < 5) {
            plVar7->dep = plVar7->dep << 8 | uVar17;
          }
          else {
            plVar7->weight_temp = bVar10;
            _lws_log(8,"PRIORITY: dep 0x%x, weight 0x%02X\n",(ulong)plVar7->dep,(ulong)bVar10);
            if ((plVar7->dep & 0x7fffffff) == plVar7->sid) {
              lws_h2_goaway(wsi,1,"cant depend on own sid");
            }
          }
          break;
        case '\x03':
        case '\b':
          plVar7->hpack_e_dep = plVar7->hpack_e_dep << 8 | uVar17;
          break;
        case '\x04':
          uVar17 = (uVar21 - plVar7->preamble) % 6;
          plVar7->one_setting[uVar17] = bVar10;
          if (uVar17 == 5) {
            lws_h2_settings(wsi,&plVar7->peer_set,plVar7->one_setting,6);
          }
          break;
        case '\x05':
        case '\n':
          break;
        case '\x06':
          if ((bVar3 & 1) == 0) {
            if (8 < uVar20) {
              return 1;
            }
            plVar7->ping_payload[uVar21] = bVar10;
          }
          break;
        case '\a':
          uVar21 = plVar7->inside;
          plVar7->inside = uVar21 + 1;
          if (uVar21 - 4 < 4) {
            plVar7->goaway_err = plVar7->goaway_err << 8 | uVar17;
          }
          else if (uVar21 < 4) {
            plVar7->goaway_last_sid = plVar7->goaway_last_sid << 8 | uVar17;
            plVar7->goaway_str[0] = '\0';
          }
          else {
            if (uVar21 - 8 < 0x1f) {
              plVar7->goaway_str[uVar21 - 8] = bVar10;
            }
            plVar7->goaway_str[0x1f] = '\0';
          }
          break;
        default:
          _lws_log(4,"%s: unhandled frame type %d\n","lws_h2_parser",(ulong)plVar7->type);
          goto LAB_0012dcd4;
        }
switchD_0012cafb_caseD_5:
        if (plVar7->count <= plVar7->length) {
          if ((plVar7->count != plVar7->length) ||
             (iVar12 = lws_h2_parse_end_of_frame(wsi), iVar12 == 0)) goto LAB_0012d486;
          goto LAB_0012dcff;
        }
        _lws_log(4,"%s: count > length %u %u\n","lws_h2_parser");
LAB_0012dcd4:
        iVar12 = 1;
        goto LAB_0012dc9f;
      }
      if (8 < bVar3) goto LAB_0012d486;
      plVar7->frame_state = bVar3 + 1;
      switch(bVar3) {
      case 0:
        plVar7->field_0xa8 = plVar7->field_0xa8 & 0x3f;
        plVar7->padding = '\0';
        plVar7->preamble = 0;
        plVar7->length = uVar17;
        plVar7->inside = 0;
        break;
      case 1:
      case 2:
        plVar7->length = plVar7->length << 8 | uVar17;
        break;
      case 3:
        plVar7->type = bVar10;
        break;
      case 4:
        plVar7->flags = bVar10;
        break;
      default:
        plVar7->sid = plVar7->sid << 8 | uVar17;
        if ((byte)(bVar3 + 1) != '\t') break;
        plVar8 = (wsi->h2).h2n;
        plVar8->count = 0;
        plVar8->swsi = wsi;
        uVar17 = plVar8->sid;
        uVar21 = uVar17 & 0x7fffffff;
        plVar8->sid = uVar21;
        if ((uVar17 & 1) == 0 && uVar21 != 0) {
          pcVar18 = "Even Stream ID";
          goto LAB_0012cacf;
        }
        if (wsi->immortal_substream_count == '\0') {
          iVar12 = wsi->vhost->keepalive_timeout;
          if (iVar12 == 0) {
            iVar12 = 0x1f;
          }
          lws_set_timeout(wsi,PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,iVar12);
          uVar21 = plVar8->sid;
        }
        if (uVar21 == 0) {
          plVar14 = plVar8->swsi;
          uVar23 = 0;
        }
        else {
          plVar14 = lws_wsi_mux_from_id(wsi,uVar21);
          plVar8->swsi = plVar14;
          uVar23 = (ulong)plVar8->sid;
        }
        _lws_log(0x10,"%p (%p): fr hdr: typ 0x%x, fla 0x%x, sid 0x%x, len 0x%x\n",wsi,plVar14,
                 (ulong)plVar8->type,(ulong)plVar8->flags,uVar23,(ulong)plVar8->length);
        if (((plVar8->field_0xa8 & 0x20) != 0) && (plVar8->highest_sid < plVar8->sid)) {
          plVar8->type = '\n';
          break;
        }
        bVar10 = plVar8->type;
        uVar23 = (ulong)bVar10;
        if (bVar10 == 10) break;
        if ((plVar8->our_set).s[5] < plVar8->length) {
          _lws_log(8,"%s: received oversize frame %d\n","lws_h2_parse_frame_header");
          lws_h2_goaway(wsi,6,"Peer ignored our frame size setting");
LAB_0012dd5f:
          iVar12 = 1;
          goto LAB_0012dc9f;
        }
        plVar14 = plVar8->swsi;
        if (plVar14 == (lws *)0x0) {
          uVar17 = plVar8->sid;
          if (bVar10 == 0) {
            if ((uVar17 <= plVar8->highest_sid_opened) && ((wsi->field_0x2e2 & 0x40) != 0)) {
              _lws_log(4,"ignoring straggling data fl 0x%x\n",(ulong)plVar8->flags);
              plVar8->type = '\n';
              uVar17 = plVar8->sid;
              plVar14 = plVar8->swsi;
              uVar23 = 10;
              if (uVar17 <= plVar8->highest_sid_opened) goto LAB_0012cf2f;
              goto LAB_0012d1ad;
            }
          }
          else {
            bVar26 = true;
            plVar14 = (lws *)0x0;
            plVar16 = (lws *)0x0;
            if (bVar10 < 3 || uVar17 <= plVar8->highest_sid_opened) goto LAB_0012d299;
LAB_0012d1ad:
            _lws_log(8,"%s: wsi %p, No child for sid %d, rxcmd %d\n","lws_h2_parse_frame_header",
                     plVar14,(ulong)uVar17,uVar23);
          }
          lws_h2_goaway(wsi,5,"Data for nonexistent sid");
          break;
        }
        _lws_log(8,"%s: wsi %p, State: %s, received cmd %d\n","lws_h2_parse_frame_header",plVar14,
                 h2_state_names[(plVar14->h2).h2_state]);
        plVar14 = plVar8->swsi;
LAB_0012cf2f:
        if (plVar14 != (lws *)0x0) {
          if (plVar8->sid == 0) {
LAB_0012cf67:
            bVar26 = false;
            plVar16 = plVar14;
            goto LAB_0012d299;
          }
          bVar10 = (plVar14->h2).h2_state;
          if ((http2_rx_validity[bVar10] >> (plVar8->type & 0x1f) & 1) != 0) goto LAB_0012cf67;
          _lws_log(8,"%s: wsi %p, State: %s, ILLEGAL cmdrx %d (OK 0x%x)\n",
                   "lws_h2_parse_frame_header",plVar14,h2_state_names[bVar10],(ulong)plVar8->type,
                   (ulong)http2_rx_validity[bVar10]);
          if (((plVar8->swsi->h2).h2_state | 2) == 6) {
            uVar22 = 5;
          }
          else {
            uVar22 = 1;
          }
          pcVar18 = "invalid rx for state";
LAB_0012d653:
          lws_h2_goaway(wsi,uVar22,pcVar18);
          break;
        }
        bVar26 = true;
        plVar16 = (lws *)0x0;
LAB_0012d299:
        if ((*(ushort *)&plVar8->field_0xa8 & 8) != 0) {
          uVar17 = plVar8->cont_exp_sid;
          uVar19 = (ulong)uVar17;
          uVar23 = uVar19;
          if (uVar17 != plVar8->sid || plVar8->type != 9) {
            _lws_log(8,"%s: expected cont on sid %u (got %d on sid %u)\n",
                     "lws_h2_parse_frame_header",(ulong)uVar17,(ulong)plVar8->type);
            uVar5 = *(ushort *)&plVar8->field_0xa8;
            *(ushort *)&plVar8->field_0xa8 = uVar5 & 0xfff7;
            if ((uVar5 & 0x10) == 0) {
              uVar22 = 1;
            }
            else {
              uVar22 = 9;
            }
            pcVar18 = "Continuation hdrs State";
            goto LAB_0012d653;
          }
LAB_0012d39a:
          _lws_log(8,"LWS_H2_FRAME_TYPE_CONTINUATION: sid = %u %d %d\n",uVar19,
                   (ulong)(*(ushort *)&plVar8->field_0xa8 >> 3 & 1),uVar23);
          if ((((plVar8->field_0xa8 & 8) == 0) ||
              (plVar8->sid == 0 || plVar8->cont_exp_sid != plVar8->sid)) ||
             (plVar14 = plVar8->swsi, plVar14 == (lws *)0x0)) {
            uVar22 = 1;
            pcVar18 = "unexpected CONTINUATION";
            goto LAB_0012d548;
          }
          if (((plVar14->h2).field_0x11 & 2) != 0) {
            uVar22 = 1;
            pcVar18 = "END_HEADERS already seen";
            goto LAB_0012dc57;
          }
LAB_0012db98:
          (plVar14->h2).field_0x11 = (plVar14->h2).field_0x11 & 0xfd | plVar8->flags >> 1 & 2;
          _lws_log(8,"%p: END_HEADERS %d\n",plVar8->swsi,
                   (ulong)((byte)(plVar8->swsi->h2).field_0x11 >> 1 & 1));
          bVar10 = (plVar8->swsi->h2).field_0x11;
          if ((bVar10 & 2) != 0) {
            plVar8->field_0xa8 = plVar8->field_0xa8 & 0xf7;
            bVar10 = (plVar8->swsi->h2).field_0x11;
          }
          _lws_log(0x10,"END_HEADERS %d\n",(ulong)(bVar10 >> 1 & 1));
          goto switchD_0012d2c9_caseD_a;
        }
        switch((ulong)plVar8->type) {
        case 0:
          _lws_log(8,"seen incoming LWS_H2_FRAME_TYPE_DATA start\n");
          if (plVar8->sid == 0) {
            _lws_log(8,"DATA: 0 sid\n");
            uVar22 = 1;
            pcVar18 = "DATA 0 sid";
          }
          else {
            _lws_log(8,"Frame header DATA: sid %u, flags 0x%x, len %u\n",(ulong)plVar8->sid,
                     (ulong)plVar8->flags,(ulong)plVar8->length);
            if (plVar8->swsi == (lws *)0x0) {
              iVar12 = 4;
              pcVar18 = "DATA: NULL swsi\n";
              goto LAB_0012d801;
            }
            _lws_log(8,"DATA rx on state %d\n",(ulong)(plVar8->swsi->h2).h2_state);
            if (((plVar8->swsi->h2).h2_state | 2) != 6) {
              if (plVar8->length != 0) goto LAB_0012d486;
              lws_h2_parse_end_of_frame(wsi);
              break;
            }
            uVar22 = 5;
            pcVar18 = "conn closed";
          }
          goto LAB_0012d548;
        case 1:
          _lws_log(8,"HEADERS: frame header: sid = %u\n",(ulong)plVar8->sid);
          uVar17 = plVar8->sid;
          if (uVar17 == 0) {
            pcVar18 = "sid 0";
LAB_0012de69:
            iVar12 = 1;
            lws_h2_goaway(wsi,1,pcVar18);
            goto LAB_0012dc9f;
          }
          plVar14 = plVar8->swsi;
          if (plVar14 == (lws *)0x0) {
            if ((wsi->field_0x2e2 & 0x40) == 0) {
              if ((((wsi->h2).h2n)->our_set).s[3] < (wsi->mux).child_count + 1) {
                pcVar18 = "Another stream not allowed";
              }
              else {
                plVar14 = lws_wsi_server_new(wsi->vhost,wsi,uVar17);
                plVar8->swsi = plVar14;
                if (plVar14 != (lws *)0x0) {
                  puVar2 = &(plVar14->h2).field_0x11;
                  *puVar2 = *puVar2 | 0x10;
                  iVar12 = lws_h2_update_peer_txcredit
                                     (plVar8->swsi,(plVar8->swsi->mux).my_sid,0x40000);
                  if (iVar12 != 0) goto LAB_0012dd5f;
                  plVar14 = plVar8->swsi;
                  goto LAB_0012d9ff;
                }
                pcVar18 = "OOM";
              }
              goto LAB_0012de69;
            }
LAB_0012da69:
            plVar14 = lws_wsi_mux_from_id(wsi,uVar17);
            plVar8->swsi = plVar14;
            _lws_log(8,"HEADERS: nwsi %p: sid %u mapped to wsi %p\n",wsi,(ulong)plVar8->sid,plVar14)
            ;
            plVar14 = plVar8->swsi;
            if (plVar14 == (lws *)0x0) break;
            goto LAB_0012db98;
          }
          if ((((plVar14->h2).field_0x11 & 3) == 2) && ((plVar8->flags & 1) == 0)) {
            pcVar18 = "extra HEADERS together";
            goto LAB_0012de69;
          }
          if ((wsi->field_0x2e2 & 0x40) != 0) goto LAB_0012da69;
LAB_0012d9ff:
          if (((plVar14->http).ah == (allocated_headers *)0x0) &&
             (iVar12 = lws_header_table_attach(plVar14,0), iVar12 != 0)) {
            iVar12 = 1;
            _lws_log(1,"%s: Failed to get ah\n","lws_h2_parse_frame_header");
            goto LAB_0012dc9f;
          }
          plVar14 = (wsi->mux).child_list;
          while (plVar14 != (lws *)0x0) {
            if (((plVar14->mux).my_sid < plVar8->sid) && ((plVar14->h2).h2_state == '\0')) {
              lws_close_free_wsi(plVar14,LWS_CLOSE_STATUS_NOSTATUS,"h2 sid close");
            }
            plVar16 = (plVar14->mux).sibling_list;
            bVar26 = plVar16 == plVar14;
            plVar14 = plVar16;
            if (bVar26) {
              __assert_fail("w->mux.sibling_list != w",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/h2/http2.c"
                            ,0x4e5,"int lws_h2_parse_frame_header(struct lws *)");
            }
          }
          plVar14 = plVar8->swsi;
          if ((plVar14->vhost->options & 0x100000000) == 0) {
            (plVar14->h2).field_0x11 = (plVar14->h2).field_0x11 & 0xfe | plVar8->flags & 1;
            _lws_log(0x10,"%s: hdr END_STREAM = %d\n","lws_h2_parse_frame_header",
                     (ulong)((byte)(plVar8->swsi->h2).field_0x11 & 1));
          }
          else {
            lws_mux_mark_immortal(plVar14);
            _lws_log(8,"%s: %p: h2 stream entering long poll\n","lws_h2_parse_frame_header",
                     plVar8->swsi);
          }
          uVar6._0_1_ = plVar8->flags;
          uVar6._1_1_ = plVar8->padding;
          uVar6._2_1_ = plVar8->weight_temp;
          uVar6._3_1_ = plVar8->huff_pad;
          plVar8->cont_exp_sid = plVar8->sid;
          *(ushort *)&plVar8->field_0xa8 =
               ((ushort)*(undefined4 *)&plVar8->field_0xa8 & 0xffe7) + (~(ushort)uVar6 & 4) * 2 +
               0x10;
          plVar14 = plVar8->swsi;
          goto LAB_0012db98;
        case 2:
          _lws_log(8,"LWS_H2_FRAME_TYPE_PRIORITY complete frame\n");
          if (plVar8->sid != 0) {
            if (plVar8->length == 5) goto LAB_0012d486;
            uVar22 = 6;
            pcVar18 = "Priority has length other than 5";
            goto LAB_0012dc57;
          }
          uVar22 = 1;
          pcVar18 = "Priority has 0 sid";
LAB_0012d548:
          lws_h2_goaway(wsi,uVar22,pcVar18);
          break;
        case 3:
          if (plVar8->sid == 0) goto LAB_0012dd5f;
          if (bVar26) {
            if (plVar8->highest_sid_opened < plVar8->sid) {
              pcVar18 = "crazy sid on RST_STREAM";
              goto LAB_0012de69;
            }
          }
          else {
            if (plVar8->length != 4) {
              uVar22 = 6;
              pcVar18 = "RST_STREAM can only be length 4";
              goto LAB_0012dc57;
            }
            lws_h2_state(plVar16,LWS_H2_STATE_CLOSED);
          }
          break;
        case 4:
          _lws_log(8,"LWS_H2_FRAME_TYPE_SETTINGS complete frame\n");
          if (plVar8->sid != 0) {
            uVar22 = 1;
            pcVar18 = "Settings has nonzero sid";
            goto LAB_0012d548;
          }
          uVar17 = plVar8->length;
          if ((plVar8->flags & 1) == 0) {
            if ((uVar17 != 0) && (uVar17 % 6 == 0)) {
              if (plVar8->type == '\n') goto LAB_0012d486;
              if (((*(ulong *)&wsi->field_0x2dc & 4) != 0) &&
                 (((*(ulong *)&wsi->field_0x2dc & 0x40) == 0 || ((wsi->flags & 0x20U) == 0)))) {
                plVar13 = (lws_h2_protocol_send *)lws_realloc((void *)0x0,0x38,"pps");
                if (plVar13 == (lws_h2_protocol_send *)0x0) goto LAB_0012dd5f;
                plVar13->type = LWS_H2_PPS_ACK_SETTINGS;
                lws_pps_schedule(wsi,plVar13);
                wsi->field_0x2dc = wsi->field_0x2dc | 0x40;
              }
              break;
            }
            uVar22 = 6;
            pcVar18 = "Settings length error";
            goto LAB_0012dc57;
          }
          if (uVar17 != 0) {
            uVar22 = 6;
            pcVar18 = "Settings with ACK not allowed payload";
            goto LAB_0012dc57;
          }
          goto LAB_0012dc72;
        case 5:
          _lws_log(8,"LWS_H2_FRAME_TYPE_PUSH_PROMISE complete frame\n");
          uVar22 = 1;
          pcVar18 = "Server only";
          goto LAB_0012dc57;
        case 6:
          if (plVar8->sid == 0) {
            if (plVar8->length == 8) goto LAB_0012d486;
            uVar22 = 6;
            pcVar18 = "Ping payload can only be 8";
          }
          else {
            uVar22 = 1;
            pcVar18 = "Ping has nonzero sid";
          }
LAB_0012dc57:
          lws_h2_goaway(wsi,uVar22,pcVar18);
          break;
        case 7:
          iVar12 = 0x10;
          pcVar18 = "LWS_H2_FRAME_TYPE_GOAWAY received\n";
          goto LAB_0012d801;
        case 8:
          if (plVar8->length != 4) {
            uVar22 = 6;
            pcVar18 = "window update frame not 4";
            goto LAB_0012dc57;
          }
          iVar12 = 8;
          pcVar18 = "LWS_H2_FRAME_TYPE_WINDOW_UPDATE\n";
LAB_0012d801:
          _lws_log(iVar12,pcVar18);
          break;
        case 9:
          uVar19 = (ulong)plVar8->sid;
          uVar23 = (ulong)plVar8->cont_exp_sid;
          goto LAB_0012d39a;
        case 10:
          break;
        default:
          _lws_log(8,"%s: ILLEGAL FRAME TYPE %d\n","lws_h2_parse_frame_header",(ulong)plVar8->type);
          plVar8->type = '\n';
        }
switchD_0012d2c9_caseD_a:
        if (plVar8->length == 0) {
LAB_0012dc72:
          plVar8->frame_state = '\0';
        }
      }
LAB_0012d486:
      inlen = uVar25;
      buf = pbVar24;
      if (inlen == 0) goto LAB_0012dc87;
      goto LAB_0012c83c;
    }
    iVar12 = 0;
  }
  goto LAB_0012dc9f;
LAB_0012dc87:
  iVar12 = 0;
LAB_0012dc9f:
  *inused = (long)pbVar24 - (long)in;
  return iVar12;
}

Assistant:

int
lws_h2_parser(struct lws *wsi, unsigned char *in, lws_filepos_t inlen,
	      lws_filepos_t *inused)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws_h2_protocol_send *pps;
	unsigned char c, *oldin = in;
	int n, m;

	if (!h2n)
		goto fail;

	while (inlen--) {

		c = *in++;

		// lwsl_notice("%s: 0x%x\n", __func__, c);

		switch (lwsi_state(wsi)) {
		case LRS_H2_AWAIT_PREFACE:
			if (preface[h2n->count++] != c)
				goto fail;

			if (preface[h2n->count])
				break;

			lwsl_info("http2: %p: established\n", wsi);
			lwsi_set_state(wsi, LRS_H2_AWAIT_SETTINGS);
			lws_validity_confirmed(wsi);
			h2n->count = 0;
			wsi->txc.tx_cr = 65535;

			/*
			 * we must send a settings frame -- empty one is OK...
			 * that must be the first thing sent by server
			 * and the peer must send a SETTINGS with ACK flag...
			 */
			pps = lws_h2_new_pps(LWS_H2_PPS_MY_SETTINGS);
			if (!pps)
				goto fail;
			lws_pps_schedule(wsi, pps);
			break;

		case LRS_H2_WAITING_TO_SEND_HEADERS:
		case LRS_ESTABLISHED:
		case LRS_H2_AWAIT_SETTINGS:
			if (h2n->frame_state != LWS_H2_FRAME_HEADER_LENGTH)
				goto try_frame_start;

			/*
			 * post-header, preamble / payload / padding part
			 */
			h2n->count++;

			if (h2n->flags & LWS_H2_FLAG_PADDED &&
			    !h2n->pad_length) {
				/*
				 * Get the padding count... actual padding is
				 * at the end of the frame.
				 */
				h2n->padding = c;
				h2n->pad_length = 1;
				h2n->preamble++;

				if (h2n->padding > h2n->length - 1)
					lws_h2_goaway(wsi,
						      H2_ERR_PROTOCOL_ERROR,
						      "execssive padding");
				break; /* we consumed this */
			}

			if (h2n->flags & LWS_H2_FLAG_PRIORITY &&
			    !h2n->collected_priority) {
				/* going to be 5 preamble bytes */

				lwsl_debug("PRIORITY FLAG:  0x%x\n", c);

				if (h2n->preamble++ - h2n->pad_length < 4) {
					h2n->dep = ((h2n->dep) << 8) | c;
					break; /* we consumed this */
				}
				h2n->weight_temp = c;
				h2n->collected_priority = 1;
				lwsl_debug("PRI FL: dep 0x%x, weight 0x%02X\n",
					   (unsigned int)h2n->dep,
					   h2n->weight_temp);
				break; /* we consumed this */
			}
			if (h2n->padding && h2n->count >
			    (h2n->length - h2n->padding)) {
				if (c) {
					lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
						      "nonzero padding");
					break;
				}
				goto frame_end;
			}

			/* applies to wsi->h2.swsi which may be wsi */
			switch(h2n->type) {

			case LWS_H2_FRAME_TYPE_SETTINGS:
				n = (h2n->count - 1 - h2n->preamble) %
				     LWS_H2_SETTINGS_LEN;
				h2n->one_setting[n] = c;
				if (n != LWS_H2_SETTINGS_LEN - 1)
					break;
				lws_h2_settings(wsi, &h2n->peer_set,
						h2n->one_setting,
						LWS_H2_SETTINGS_LEN);
				break;

			case LWS_H2_FRAME_TYPE_CONTINUATION:
			case LWS_H2_FRAME_TYPE_HEADERS:
				if (!h2n->swsi)
					break;
				if (lws_hpack_interpret(h2n->swsi, c)) {
					lwsl_info("%s: hpack failed\n",
						  __func__);
					goto fail;
				}
				break;

			case LWS_H2_FRAME_TYPE_GOAWAY:
				switch (h2n->inside++) {
				case 0:
				case 1:
				case 2:
				case 3:
					h2n->goaway_last_sid <<= 8;
					h2n->goaway_last_sid |= c;
					h2n->goaway_str[0] = '\0';
					break;

				case 4:
				case 5:
				case 6:
				case 7:
					h2n->goaway_err <<= 8;
					h2n->goaway_err |= c;
					break;

				default:
					if (h2n->inside - 9 <
					    sizeof(h2n->goaway_str) - 1)
						h2n->goaway_str[
						           h2n->inside - 9] = c;
					h2n->goaway_str[
					    sizeof(h2n->goaway_str) - 1] = '\0';
					break;
				}
				break;

			case LWS_H2_FRAME_TYPE_DATA:

				lwsl_info("%s: LWS_H2_FRAME_TYPE_DATA: fl 0x%x\n",
					  __func__, h2n->flags);

				/*
				 * let the network wsi live a bit longer if
				 * subs are active... our frame may take a long
				 * time to chew through
				 */
				if (!wsi->immortal_substream_count)
					lws_set_timeout(wsi,
					PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,
						wsi->vhost->keepalive_timeout ?
					    wsi->vhost->keepalive_timeout : 31);

				if (!h2n->swsi)
					break;

				if (lws_buflist_next_segment_len(
						&h2n->swsi->buflist, NULL))
					lwsl_info("%s: substream has pending\n",
						  __func__);

				if (lwsi_role_http(h2n->swsi) &&
				    lwsi_state(h2n->swsi) == LRS_ESTABLISHED) {
					lwsi_set_state(h2n->swsi, LRS_BODY);
					lwsl_info("%s: swsi %p to LRS_BODY\n",
							__func__, h2n->swsi);
				}

				if (lws_hdr_total_length(h2n->swsi,
					     WSI_TOKEN_HTTP_CONTENT_LENGTH) &&
				    h2n->swsi->http.rx_content_length &&
				    h2n->swsi->http.rx_content_remain <
						    inlen + 1 && /* last */
				    h2n->inside < h2n->length) {
					/* unread data in frame */
					lws_h2_goaway(wsi,
						      H2_ERR_PROTOCOL_ERROR,
					    "More rx than content_length told");
					break;
				}

				/*
				 * We operate on a frame.  The RX we have at
				 * hand may exceed the current frame.
				 */

				n = (int)inlen + 1;
				if (n > (int)(h2n->length - h2n->count + 1)) {
					n = h2n->length - h2n->count + 1;
					lwsl_debug("---- restricting len to %d "
						   "vs %ld\n", n, (long)inlen + 1);
				}
#if defined(LWS_WITH_CLIENT)
				if (h2n->swsi->client_mux_substream) {
					if (!h2n->swsi->protocol) {
						lwsl_err("%s: swsi %p doesn't have protocol\n",
							 __func__, h2n->swsi);
						m = 1;
					} else {
						h2n->swsi->txc.peer_tx_cr_est -= n;
						wsi->txc.peer_tx_cr_est -= n;
						lws_wsi_txc_describe(&h2n->swsi->txc,
							__func__,
							h2n->swsi->mux.my_sid);
					m = user_callback_handle_rxflow(
						h2n->swsi->protocol->callback,
						h2n->swsi,
					  LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,
						h2n->swsi->user_space,
						in - 1, n);
					}

					in += n - 1;
					h2n->inside += n;
					h2n->count += n - 1;
					inlen -= n - 1;

					if (m) {
						lwsl_info("RECEIVE_CLIENT_HTTP "
							  "closed it\n");
						goto close_swsi_and_return;
					}

					break;
				}
#endif

				if (lwsi_state(h2n->swsi) == LRS_DEFERRING_ACTION) {
					m = lws_buflist_append_segment(
						&h2n->swsi->buflist, in - 1, n);
					if (m < 0)
						return -1;
					if (m) {
						struct lws_context_per_thread *pt;

						pt = &wsi->context->pt[(int)wsi->tsi];
						lwsl_debug("%s: added %p to rxflow list\n",
							   __func__, wsi);
						lws_dll2_add_head(
							&h2n->swsi->dll_buflist,
							&pt->dll_buflist_owner);
					}
					in += n - 1;
					h2n->inside += n;
					h2n->count += n - 1;
					inlen -= n - 1;

					lwsl_debug("%s: deferred %d\n", __func__, n);
					goto do_windows;
				}

				h2n->swsi->outer_will_close = 1;
				/*
				 * choose the length for this go so that we end at
				 * the frame boundary, in the case there is already
				 * more waiting leave it for next time around
				 */

				n = lws_read_h1(h2n->swsi, in - 1, n);
				// lwsl_notice("%s: lws_read_h1 %d\n", __func__, n);
				h2n->swsi->outer_will_close = 0;
				/*
				 * can return 0 in POST body with
				 * content len exhausted somehow.
				 */
				if (n < 0 ||
				    (!n && !lws_buflist_next_segment_len(
						    &wsi->buflist, NULL))) {
					lwsl_info("%s: lws_read_h1 told %d %u / %u\n",
						__func__, n,
						(unsigned int)h2n->count,
						(unsigned int)h2n->length);
					in += h2n->length - h2n->count;
					h2n->inside = h2n->length;
					h2n->count = h2n->length - 1;

					//if (n < 0)
					//	goto already_closed_swsi;
					goto close_swsi_and_return;
				}

				inlen -= n - 1;
				in += n - 1;
				h2n->inside += n;
				h2n->count += n - 1;
				h2n->swsi->txc.peer_tx_cr_est -= n;
				wsi->txc.peer_tx_cr_est -= n;

do_windows:

#if defined(LWS_WITH_CLIENT)
				if (!(h2n->swsi->flags & LCCSCF_H2_MANUAL_RXFLOW))
#endif
				{
					/*
					 * The default behaviour is we just keep
					 * cranking the other side's tx credit
					 * back up, for simple bulk transfer as
					 * fast as we can take it
					 */

					m = n; //(2 * h2n->length) + 65536;

					/* update both the stream and nwsi */

					lws_h2_update_peer_txcredit_thresh(h2n->swsi,
								    h2n->sid, m, m);
				}
#if defined(LWS_WITH_CLIENT)
				else {
					/*
					 * If he's handling it himself, only
					 * repair the nwsi credit but allow the
					 * stream credit to run down until the
					 * user code deals with it
					 */
					lws_h2_update_peer_txcredit(wsi, 0, n);
					h2n->swsi->txc.manual = 1;
				}
#endif
				break;

			case LWS_H2_FRAME_TYPE_PRIORITY:
				if (h2n->count <= 4) {
					h2n->dep <<= 8;
					h2n->dep |= c;
					break;
				}
				h2n->weight_temp = c;
				lwsl_info("PRIORITY: dep 0x%x, weight 0x%02X\n",
					  (unsigned int)h2n->dep, h2n->weight_temp);

				if ((h2n->dep & ~(1u << 31)) == h2n->sid) {
					lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
						      "cant depend on own sid");
					break;
				}
				break;

			case LWS_H2_FRAME_TYPE_RST_STREAM:
				h2n->hpack_e_dep <<= 8;
				h2n->hpack_e_dep |= c;
				break;

			case LWS_H2_FRAME_TYPE_PUSH_PROMISE:
				break;

			case LWS_H2_FRAME_TYPE_PING:
				if (h2n->flags & LWS_H2_FLAG_SETTINGS_ACK) { // ack
				} else { /* they're sending us a ping request */
					if (h2n->count > 8)
						return 1;
					h2n->ping_payload[h2n->count - 1] = c;
				}
				break;

			case LWS_H2_FRAME_TYPE_WINDOW_UPDATE:
				h2n->hpack_e_dep <<= 8;
				h2n->hpack_e_dep |= c;
				break;

			case LWS_H2_FRAME_TYPE_COUNT: /* IGNORING FRAME */
				break;

			default:
				lwsl_notice("%s: unhandled frame type %d\n",
					    __func__, h2n->type);

				goto fail;
			}

frame_end:
			if (h2n->count > h2n->length) {
				lwsl_notice("%s: count > length %u %u\n",
					    __func__, (unsigned int)h2n->count,
					    (unsigned int)h2n->length);
				goto fail;
			}
			if (h2n->count != h2n->length)
				break;

			/*
			 * end of frame just happened
			 */
			if (lws_h2_parse_end_of_frame(wsi))
				goto fail;

			break;

try_frame_start:
			if (h2n->frame_state <= 8) {

				switch (h2n->frame_state++) {
				case 0:
					h2n->pad_length = 0;
					h2n->collected_priority = 0;
					h2n->padding = 0;
					h2n->preamble = 0;
					h2n->length = c;
					h2n->inside = 0;
					break;
				case 1:
				case 2:
					h2n->length <<= 8;
					h2n->length |= c;
					break;
				case 3:
					h2n->type = c;
					break;
				case 4:
					h2n->flags = c;
					break;

				case 5:
				case 6:
				case 7:
				case 8:
					h2n->sid <<= 8;
					h2n->sid |= c;
					break;
				}
			}

			if (h2n->frame_state == LWS_H2_FRAME_HEADER_LENGTH)
				if (lws_h2_parse_frame_header(wsi))
					goto fail;
			break;

		default:
			break;
		}
	}

	*inused = in - oldin;

	return 0;

close_swsi_and_return:

	lws_close_free_wsi(h2n->swsi, 0, "close_swsi_and_return");
	h2n->swsi = NULL;
	h2n->frame_state = 0;
	h2n->count = 0;

// already_closed_swsi:
	*inused = in - oldin;

	return 2;

fail:
	*inused = in - oldin;

	return 1;
}

#if defined(LWS_WITH_CLIENT)
int
lws_h2_client_handshake(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	uint8_t *buf, *start, *p, *p1, *end;
	char *meth = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_METHOD),
	     *uri = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_URI);
	struct lws *nwsi = lws_get_network_wsi(wsi);
	int n, m;
	/*
	 * The identifier of a newly established stream MUST be numerically
	 * greater than all streams that the initiating endpoint has opened or
	 * reserved.  This governs streams that are opened using a HEADERS frame
	 * and streams that are reserved using PUSH_PROMISE.  An endpoint that
	 * receives an unexpected stream identifier MUST respond with a
	 * connection error (Section 5.4.1) of type PROTOCOL_ERROR.
	 */
	int sid = nwsi->h2.h2n->highest_sid_opened + 2;

	lwsl_debug("%s\n", __func__);

	nwsi->h2.h2n->highest_sid_opened = sid;
	wsi->mux.my_sid = sid;

	lwsl_info("%s: CLIENT_WAITING_TO_SEND_HEADERS: pollout (sid %d)\n",
			__func__, wsi->mux.my_sid);

	p = start = buf = pt->serv_buf + LWS_PRE;
	end = start + (wsi->context->pt_serv_buf_size / 2) - LWS_PRE - 1;

	/* it's time for us to send our client stream headers */

	if (!meth)
		meth = "GET";

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_METHOD,
				(unsigned char *)meth,
				(int)strlen(meth), &p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_SCHEME,
				(unsigned char *)"https", 5,
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_PATH,
				(unsigned char *)uri,
				lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_URI),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_AUTHORITY,
				(unsigned char *)lws_hdr_simple_ptr(wsi,
						_WSI_TOKEN_CLIENT_ORIGIN),
			lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_ORIGIN),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HOST,
				(unsigned char *)lws_hdr_simple_ptr(wsi,
						_WSI_TOKEN_CLIENT_HOST),
			lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_HOST),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_USER_AGENT,
				(unsigned char *)"lwsss", 5,
				&p, end))
		goto fail_length;

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME) {
		p1 = lws_http_multipart_headers(wsi, p);
		if (!p1)
			goto fail_length;
		p = p1;
	}

	if (wsi->flags & LCCSCF_HTTP_X_WWW_FORM_URLENCODED) {
		if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE,
			   (unsigned char *)"application/x-www-form-urlencoded",
			   33, &p, end))
			goto fail_length;
		lws_client_http_body_pending(wsi, 1);
	}

	/* give userland a chance to append, eg, cookies */

	if (wsi->protocol->callback(wsi,
				LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER,
				wsi->user_space, &p, (end - p) - 12))
		goto fail_length;

	if (lws_finalize_http_header(wsi, &p, end))
		goto fail_length;

#if defined(LWS_WITH_DETAILED_LATENCY)
	wsi->detlat.earliest_write_req_pre_write = lws_now_usecs();
#endif

	m = LWS_WRITE_HTTP_HEADERS;
#if defined(LWS_WITH_CLIENT)
	/* below is not needed in spec, indeed it destroys the long poll
	 * feature, but required by nghttp2 */
	if ((wsi->flags & LCCSCF_H2_QUIRK_NGHTTP2_END_STREAM) &&
	    !(wsi->client_http_body_pending))
		m |= LWS_WRITE_H2_STREAM_END;
#endif

	// lwsl_hexdump_notice(start, p - start);

	n = lws_write(wsi, start, p - start, m);

	if (n != (p - start)) {
		lwsl_err("_write returned %d from %ld\n", n,
			 (long)(p - start));
		return -1;
	}

	/*
	 * Normally let's charge up the peer tx credit a bit.  But if
	 * MANUAL_REFLOW is set, just set it to the initial credit given in
	 * the client create info
	 */

	n = 4 * 65536;
	if (wsi->flags & LCCSCF_H2_MANUAL_RXFLOW) {
		n = wsi->txc.manual_initial_tx_credit;
		wsi->txc.manual = 1;
	}

	if (lws_h2_update_peer_txcredit(wsi, sid, n))
		return 1;

	lws_h2_state(wsi, LWS_H2_STATE_OPEN);
	lwsi_set_state(wsi, LRS_ESTABLISHED);

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME)
		lws_callback_on_writable(wsi);

	return 0;

fail_length:
	lwsl_err("Client hdrs too long: incr context info.pt_serv_buf_size\n");

	return -1;
}
#endif

int
lws_h2_ws_handshake(struct lws *wsi)
{
	uint8_t buf[LWS_PRE + 2048], *p = buf + LWS_PRE, *start = p,
		*end = &buf[sizeof(buf) - 1];
	const struct lws_http_mount *hit;
	const char * uri_ptr;
	int n, m;

	if (lws_add_http_header_status(wsi, HTTP_STATUS_OK, &p, end))
		return -1;

	if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) > 64)
		return -1;

	if (wsi->proxied_ws_parent && wsi->child_list) {
		if (lws_hdr_simple_ptr(wsi, WSI_TOKEN_PROTOCOL)) {
			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(uint8_t *)lws_hdr_simple_ptr(wsi,
							   WSI_TOKEN_PROTOCOL),
				(int)strlen(lws_hdr_simple_ptr(wsi,
							   WSI_TOKEN_PROTOCOL)),
						 &p, end))
			return -1;
		}
	} else {

		/* we can only return the protocol header if:
		 *  - one came in, and ... */
		if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) &&
		    /*  - it is not an empty string */
		    wsi->protocol->name && wsi->protocol->name[0]) {
			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(unsigned char *)wsi->protocol->name,
				(int)strlen(wsi->protocol->name), &p, end))
			return -1;
		}
	}

	if (lws_finalize_http_header(wsi, &p, end))
		return -1;

	m = lws_ptr_diff(p, start);
	// lwsl_hexdump_notice(start, m);
	n = lws_write(wsi, start, m, LWS_WRITE_HTTP_HEADERS);
	if (n != m) {
		lwsl_err("_write returned %d from %d\n", n, m);

		return -1;
	}

	/*
	 * alright clean up, set our state to generic ws established, the
	 * mode / state of the nwsi will get the h2 processing done.
	 */

	lwsi_set_state(wsi, LRS_ESTABLISHED);
	wsi->lws_rx_parse_state = 0; // ==LWS_RXPS_NEW;

	uri_ptr = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_COLON_PATH);
	n = lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COLON_PATH);
	hit = lws_find_mount(wsi, uri_ptr, n);

	if (hit && hit->cgienv &&
	    wsi->protocol->callback(wsi, LWS_CALLBACK_HTTP_PMO, wsi->user_space,
				    (void *)hit->cgienv, 0))
		return 1;

	lws_validity_confirmed(wsi);

	return 0;
}

int
lws_read_h2(struct lws *wsi, unsigned char *buf, lws_filepos_t len)
{
	unsigned char *oldbuf = buf;
	lws_filepos_t body_chunk_len;

	// lwsl_notice("%s: h2 path: wsistate 0x%x len %d\n", __func__,
	//		wsi->wsistate, (int)len);

	/*
	 * wsi here is always the network connection wsi, not a stream
	 * wsi.  Once we unpicked the framing we will find the right
	 * swsi and make it the target of the frame.
	 *
	 * If it's ws over h2, the nwsi will get us here to do the h2
	 * processing, and that will call us back with the swsi +
	 * ESTABLISHED state for the inner payload, handled in a later
	 * case.
	 */
	while (len) {
		int m;

		/*
		 * we were accepting input but now we stopped doing so
		 */
		if (lws_is_flowcontrolled(wsi)) {
			lws_rxflow_cache(wsi, buf, 0, (int)len);
			buf += len;
			break;
		}

		/*
		 * lws_h2_parser() may send something; when it gets the
		 * whole frame, it will want to perform some action
		 * involving a reply.  But we may be in a partial send
		 * situation on the network wsi...
		 *
		 * Even though we may be in a partial send and unable to
		 * send anything new, we still have to parse the network
		 * wsi in order to gain tx credit to send, which is
		 * potentially necessary to clear the old partial send.
		 *
		 * ALL network wsi-specific frames are sent by PPS
		 * already, these are sent as a priority on the writable
		 * handler, and so respect partial sends.  The only
		 * problem is when a stream wsi wants to send an, eg,
		 * reply headers frame in response to the parsing
		 * we will do now... the *stream wsi* must stall in a
		 * different state until it is able to do so from a
		 * priority on the WRITABLE callback, same way that
		 * file transfers operate.
		 */

		m = lws_h2_parser(wsi, buf, len, &body_chunk_len);
		if (m && m != 2) {
			lwsl_debug("%s: http2_parser bail: %d\n", __func__, m);
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "lws_read_h2 bail");

			return -1;
		}
		if (m == 2) {
			/* swsi has been closed */
			buf += body_chunk_len;
			break;
		}

		buf += body_chunk_len;
		len -= body_chunk_len;
	}

	return lws_ptr_diff(buf, oldbuf);
}

int
lws_h2_client_stream_long_poll_rxonly(struct lws *wsi)
{

	if (!wsi->mux_substream)
		return 1;

	/*
	 * Elect to send an empty DATA with END_STREAM, to force the stream
	 * into HALF_CLOSED LOCAL
	 */
	wsi->h2.long_poll = 1;
	wsi->h2.send_END_STREAM = 1;

	// lws_header_table_detach(wsi, 0);

	lws_callback_on_writable(wsi);

	return 0;
}